

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O1

void __thiscall
rtosc::MidiMapperRT::handleCC(MidiMapperRT *this,int par,int val,char chan,bool isNrpn)

{
  MidiMapperStorage *this_00;
  bool bVar1;
  ulong uVar2;
  char cVar3;
  bool bVar4;
  ulong uVar5;
  uint ID;
  undefined7 in_register_00000081;
  char msg [1024];
  char *local_460;
  _Any_data local_458;
  code *local_448;
  char local_438 [1032];
  
  cVar3 = '\x01';
  if ('\x01' < chan) {
    cVar3 = chan;
  }
  ID = (int)CONCAT71(in_register_00000081,isNrpn) * 0x40000 + par +
       (uint)(cVar3 - 1U & 0xf) * 0x4000;
  this_00 = this->storage;
  bVar1 = this_00 != (MidiMapperStorage *)0x0;
  if (this_00 == (MidiMapperStorage *)0x0) {
LAB_00114301:
    if ((this->pending).vals[0] != ID) {
      uVar2 = 0;
      do {
        uVar5 = uVar2;
        if (uVar5 == 0x1f) break;
        uVar2 = uVar5 + 1;
      } while ((this->pending).vals[uVar5 + 1] != ID);
      if (0x1e < uVar5) {
        bVar4 = this->watchSize != 0;
        goto LAB_00114327;
      }
    }
  }
  else {
    std::function<void_(const_char_*)>::function
              ((function<void_(const_char_*)> *)&local_458,&this->backend);
    bVar4 = MidiMapperStorage::handleCC(this_00,ID,val,(write_cb *)&local_458);
    if (!bVar4) goto LAB_00114301;
    bVar1 = true;
  }
  bVar4 = false;
LAB_00114327:
  if ((bVar1) && (local_448 != (code *)0x0)) {
    (*local_448)(&local_458,&local_458,__destroy_functor);
  }
  if (bVar4) {
    this->watchSize = this->watchSize - 1;
    PendingQueue::insert(&this->pending,ID);
    rtosc_message(local_438,0x400,"/midi-use-CC","i",(ulong)ID);
    local_460 = local_438;
    if ((this->frontend).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->frontend)._M_invoker)((_Any_data *)&this->frontend,&local_460);
  }
  return;
}

Assistant:

void MidiMapperRT::handleCC(int par, int val, char chan, bool isNrpn) {
    
    if(chan<1) chan=1;
    int ID = (isNrpn<<18) + (((chan-1)&0x0f)<<14) + par;
    //printf("handling CC(%d,%d){%d,%d,%d}\n", ID, val, (int)storage, pending.has(ID), watchSize);
    if((!storage || !storage->handleCC(ID, val, backend)) && !pending.has(ID) && watchSize) {
        watchSize--;
        pending.insert(ID);
        char msg[1024];
        rtosc_message(msg, 1024, "/midi-use-CC", "i", ID);
        frontend(msg);
    }
}